

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

string * anon_unknown.dwarf_1785d::getIDLAbsolute
                   (string *__return_storage_ptr__,Type *type,IDLExport *exporter,string *field_name
                   )

{
  ulong uVar1;
  string local_b8;
  undefined1 local_88 [8];
  string ns;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  base;
  string *field_name_local;
  IDLExport *exporter_local;
  Type *type_local;
  
  base.second.field_2._8_8_ = field_name;
  getIDLBase((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&ns.field_2 + 8),type,exporter,field_name);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)local_88,(string *)(ns.field_2._M_local_buf + 8));
    boost::algorithm::replace_all<std::__cxx11::string,char_const*,char[3]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               &Typelib::NamespaceMarkString,(char (*) [3])"::");
    normalizeIDLName(&local_b8,(string *)local_88);
    std::operator+(__return_storage_ptr__,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&base.first.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(base.first.field_2._M_local_buf + 8));
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&ns.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

static string getIDLAbsolute(Type const& type, IDLExport const& exporter, std::string const& field_name = std::string())
    {
        pair<string, string> base = getIDLBase(type, exporter, field_name);
        if (!base.first.empty())
        {
            std::string ns = base.first;
            boost::replace_all(ns, Typelib::NamespaceMarkString, "::");
            return normalizeIDLName(ns) + base.second;
        }
        else return base.second;
    }